

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# playera.cpp
# Opt level: O0

UINT8 __thiscall PlayerA::UnloadFile(PlayerA *this)

{
  int iVar1;
  UINT8 retVal;
  PlayerA *this_local;
  
  if (this->_player == (PlayerBase *)0x0) {
    this_local._7_1_ = 0xff;
  }
  else {
    (*this->_player->_vptr_PlayerBase[0x20])();
    iVar1 = (*this->_player->_vptr_PlayerBase[6])();
    this_local._7_1_ = (UINT8)iVar1;
    this->_player = (PlayerBase *)0x0;
    this->_dLoad = (DATA_LOADER *)0x0;
  }
  return this_local._7_1_;
}

Assistant:

UINT8 PlayerA::UnloadFile(void)
{
	if (_player == NULL)
		return 0xFF;
	
	_player->Stop();
	UINT8 retVal = _player->UnloadFile();
	_player = NULL;
	_dLoad = NULL;
	return retVal;
}